

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void std::__insertion_sort<QList<QGraphicsItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
               (ulong *__first,ulong *__last)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  ulong *puVar6;
  value_type __val;
  long lVar7;
  ulong *puVar8;
  long lVar9;
  
  if (__first != __last) {
    puVar6 = __first;
    for (puVar5 = __first + 1; puVar5 != __last; puVar5 = puVar5 + 1) {
      uVar3 = *puVar5;
      if (uVar3 < *__first) {
        lVar9 = (long)puVar5 - (long)__first >> 3;
        puVar8 = __first;
        if (0 < lVar9) {
          lVar7 = 1;
          do {
            puVar6[lVar7] = puVar6[lVar7 + -1];
            lVar2 = lVar9 + lVar7;
            lVar7 = lVar7 + -1;
          } while (1 < lVar2 - 1U);
        }
      }
      else {
        uVar4 = *puVar6;
        puVar8 = puVar5;
        while (uVar3 < uVar4) {
          *puVar8 = uVar4;
          puVar1 = puVar8 + -2;
          puVar8 = puVar8 + -1;
          uVar4 = *puVar1;
        }
      }
      *puVar8 = uVar3;
      puVar6 = puVar6 + 1;
    }
  }
  return;
}

Assistant:

inline constexpr bool operator!=(iterator o) const { return i != o.i; }